

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool __thiscall S2Loop::DecodeCompressed(S2Loop *this,Decoder *decoder,int snap_level)

{
  byte bVar1;
  byte *pbVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  S2Point *__s;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  Span<Vector3<double>_> points;
  S2LatLngRect SStack_58;
  
  pbVar5 = decoder->buf_;
  pbVar2 = decoder->limit_;
  if (pbVar5 < pbVar2) {
    pbVar6 = pbVar5 + 1;
    uVar9 = *pbVar5 & 0x7f;
    if ((char)*pbVar5 < '\0') {
      if (pbVar2 <= pbVar6) {
        return false;
      }
      pbVar6 = pbVar5 + 2;
      uVar9 = uVar9 | (pbVar5[1] & 0x7f) << 7;
      if ((char)pbVar5[1] < '\0') {
        if (pbVar2 <= pbVar6) {
          return false;
        }
        pbVar6 = pbVar5 + 3;
        uVar9 = uVar9 | (pbVar5[2] & 0x7f) << 0xe;
        if ((char)pbVar5[2] < '\0') {
          if (pbVar2 <= pbVar6) {
            return false;
          }
          pbVar6 = pbVar5 + 4;
          uVar9 = uVar9 | (pbVar5[3] & 0x7f) << 0x15;
          if ((char)pbVar5[3] < '\0') {
            if (pbVar2 <= pbVar6) {
              return false;
            }
            if (0xf < pbVar5[4]) {
              return false;
            }
            pbVar6 = pbVar5 + 5;
            uVar9 = (uint)pbVar5[4] << 0x1c | uVar9;
          }
        }
      }
    }
    decoder->buf_ = pbVar6;
    if (uVar9 - 1 < (uint)FLAGS_s2polygon_decode_max_num_vertices) {
      (this->unindexed_contains_calls_).super___atomic_base<int>._M_i = 0;
      MutableS2ShapeIndex::Clear(&this->index_);
      if ((this->owns_vertices_ == true) && (this->vertices_ != (S2Point *)0x0)) {
        operator_delete__(this->vertices_);
      }
      this->num_vertices_ = uVar9;
      uVar8 = (ulong)(int)uVar9;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar8;
      uVar7 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
        uVar7 = SUB168(auVar3 * ZEXT816(0x18),0);
      }
      __s = (S2Point *)operator_new__(uVar7);
      memset(__s,0,((uVar8 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      this->vertices_ = __s;
      this->owns_vertices_ = true;
      points.len_ = uVar8;
      points.ptr_ = __s;
      bVar4 = S2DecodePointsCompressed(decoder,snap_level,points);
      if (!bVar4) {
        return false;
      }
      pbVar5 = decoder->buf_;
      pbVar2 = decoder->limit_;
      if (pbVar5 < pbVar2) {
        pbVar6 = pbVar5 + 1;
        bVar1 = *pbVar5;
        if ((char)bVar1 < '\0') {
          if (pbVar2 <= pbVar6) {
            return false;
          }
          pbVar6 = pbVar5 + 2;
          if ((char)pbVar5[1] < '\0') {
            if (pbVar2 <= pbVar6) {
              return false;
            }
            pbVar6 = pbVar5 + 3;
            if ((char)pbVar5[2] < '\0') {
              if (pbVar2 <= pbVar6) {
                return false;
              }
              pbVar6 = pbVar5 + 4;
              if ((char)pbVar5[3] < '\0') {
                if (pbVar2 <= pbVar6) {
                  return false;
                }
                if (0xf < pbVar5[4]) {
                  return false;
                }
                pbVar6 = pbVar5 + 5;
              }
            }
          }
        }
        decoder->buf_ = pbVar6;
        this->origin_inside_ = (bool)(bVar1 & 1);
        if (pbVar6 < pbVar2) {
          pbVar5 = pbVar6 + 1;
          uVar9 = *pbVar6 & 0x7f;
          if ((char)*pbVar6 < '\0') {
            if (pbVar2 <= pbVar5) {
              return false;
            }
            pbVar5 = pbVar6 + 2;
            uVar9 = uVar9 | (pbVar6[1] & 0x7f) << 7;
            if ((char)pbVar6[1] < '\0') {
              if (pbVar2 <= pbVar5) {
                return false;
              }
              pbVar5 = pbVar6 + 3;
              uVar9 = uVar9 | (pbVar6[2] & 0x7f) << 0xe;
              if ((char)pbVar6[2] < '\0') {
                if (pbVar2 <= pbVar5) {
                  return false;
                }
                pbVar5 = pbVar6 + 4;
                uVar9 = uVar9 | (pbVar6[3] & 0x7f) << 0x15;
                if ((char)pbVar6[3] < '\0') {
                  if (pbVar2 <= pbVar5) {
                    return false;
                  }
                  if (0xf < pbVar6[4]) {
                    return false;
                  }
                  pbVar5 = pbVar6 + 5;
                  uVar9 = uVar9 | (uint)pbVar6[4] << 0x1c;
                }
              }
            }
          }
          decoder->buf_ = pbVar5;
          this->depth_ = uVar9;
          if ((bVar1 & 2) == 0) {
            InitBound(this);
          }
          else {
            bVar4 = S2LatLngRect::Decode(&this->bound_,decoder);
            if (!bVar4) {
              return false;
            }
            S2LatLngRectBounder::ExpandForSubregions(&SStack_58,&this->bound_);
            (this->subregion_bound_).lng_.bounds_.c_[0] = SStack_58.lng_.bounds_.c_[0];
            (this->subregion_bound_).lng_.bounds_.c_[1] = SStack_58.lng_.bounds_.c_[1];
            (this->subregion_bound_).lat_.bounds_.c_[0] = SStack_58.lat_.bounds_.c_[0];
            (this->subregion_bound_).lat_.bounds_.c_[1] = SStack_58.lat_.bounds_.c_[1];
          }
          InitIndex(this);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool S2Loop::DecodeCompressed(Decoder* decoder, int snap_level) {
  // get_varint32 takes a uint32*, but num_vertices_ is signed.
  // Decode to a temporary variable to avoid reinterpret_cast.
  uint32 unsigned_num_vertices;
  if (!decoder->get_varint32(&unsigned_num_vertices)) {
    return false;
  }
  if (unsigned_num_vertices == 0 ||
      unsigned_num_vertices > FLAGS_s2polygon_decode_max_num_vertices) {
    return false;
  }
  ClearIndex();
  if (owns_vertices_) delete[] vertices_;
  num_vertices_ = unsigned_num_vertices;
  vertices_ = new S2Point[num_vertices_];
  owns_vertices_ = true;

  if (!S2DecodePointsCompressed(decoder, snap_level,
                                MakeSpan(vertices_, num_vertices_))) {
    return false;
  }
  uint32 properties_uint32;
  if (!decoder->get_varint32(&properties_uint32)) {
    return false;
  }
  const std::bitset<kNumProperties> properties(properties_uint32);
  origin_inside_ = properties.test(kOriginInside);

  uint32 unsigned_depth;
  if (!decoder->get_varint32(&unsigned_depth)) {
    return false;
  }
  depth_ = unsigned_depth;

  if (properties.test(kBoundEncoded)) {
    if (!bound_.Decode(decoder)) {
      return false;
    }
    subregion_bound_ = S2LatLngRectBounder::ExpandForSubregions(bound_);
  } else {
    InitBound();
  }
  InitIndex();
  return true;
}